

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O2

void __thiscall
Gluco::OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted>::clean
          (OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted> *this,int *idx)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  vec<unsigned_int> *this_00;
  
  this_00 = (this->occs).data + *idx;
  lVar3 = 0;
  iVar5 = 0;
  for (lVar4 = 0; lVar4 < this_00->sz; lVar4 = lVar4 + 1) {
    bVar1 = SimpSolver::ClauseDeleted::operator()
                      (&this->deleted,(CRef *)((long)this_00->data + lVar3));
    if (!bVar1) {
      lVar2 = (long)iVar5;
      iVar5 = iVar5 + 1;
      this_00->data[lVar2] = this_00->data[lVar4];
    }
    lVar3 = lVar3 + 4;
  }
  vec<unsigned_int>::shrink(this_00,(int)lVar4 - iVar5);
  (this->dirty).data[*idx] = '\0';
  return;
}

Assistant:

void OccLists<Idx,Vec,Deleted>::clean(const Idx& idx)
{
    Vec& vec = occs[toInt(idx)];
    int  i, j;
    for (i = j = 0; i < vec.size(); i++)
        if (!deleted(vec[i]))
            vec[j++] = vec[i];
    vec.shrink(i - j);
    dirty[toInt(idx)] = 0;
}